

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# inference.h
# Opt level: O0

void __thiscall xLearn::Predictor::~Predictor(Predictor *this)

{
  long in_RDI;
  vector<float,_std::allocator<float>_> *unaff_retaddr;
  
  std::vector<float,_std::allocator<float>_>::~vector(unaff_retaddr);
  std::__cxx11::string::~string((string *)(in_RDI + 0x18));
  return;
}

Assistant:

~Predictor() { }